

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O0

void qDrawPlainRoundedRect
               (QPainter *p,int x,int y,int w,int h,qreal rx,qreal ry,QColor *c,int lineWidth,
               QBrush *fill)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QPainterStateGuard *in_RDI;
  int in_R8D;
  QColor *in_R9;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double aleft;
  double in_XMM1_Qa;
  int in_stack_00000008;
  QBrush *in_stack_00000010;
  double lw2;
  QRectF rect;
  QRectF r;
  QPainterStateGuard painterGuard;
  char *in_stack_fffffffffffffef8;
  QPainterStateGuard *pQVar1;
  QPainterStateGuard *in_stack_ffffffffffffff00;
  uint7 in_stack_ffffffffffffff08;
  bool bVar2;
  QPainterStateGuard *in_stack_ffffffffffffff10;
  QMarginsF *in_stack_ffffffffffffff60;
  QRectF *in_stack_ffffffffffffff68;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  QRectF local_70;
  QBrush local_50 [8];
  QBrush local_48 [8];
  QPen local_40 [8];
  char local_38 [32];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ECX != 0) && (in_R8D != 0)) {
    bVar2 = true;
    if ((-1 < in_ECX) && (bVar2 = true, -1 < in_R8D)) {
      bVar2 = in_stack_00000008 < 0;
    }
    if (bVar2 == false) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QPainterStateGuard::QPainterStateGuard
                (in_stack_ffffffffffffff10,(QPainter *)(ulong)in_stack_ffffffffffffff08,
                 (InitialState)((ulong)in_stack_ffffffffffffff00 >> 0x38));
      if ((in_stack_00000008 != 0) || (in_stack_00000010 != (QBrush *)0x0)) {
        if (0 < in_stack_00000008) {
          in_stack_ffffffffffffff00 = in_RDI;
          QBrush::QBrush(local_48,in_R9,SolidPattern);
          QPen::QPen(local_40,local_48,(double)in_stack_00000008,SolidLine,SquareCap,BevelJoin);
          QPainter::setPen((QPen *)in_stack_ffffffffffffff00);
          QPen::~QPen(local_40);
          QBrush::~QBrush(local_48);
        }
        pQVar1 = in_RDI;
        if (in_stack_00000010 == (QBrush *)0x0) {
          QBrush::QBrush(local_50,NoBrush);
        }
        else {
          QBrush::QBrush(local_50,in_stack_00000010);
        }
        QPainter::setBrush((QBrush *)pQVar1);
        QBrush::~QBrush(local_50);
        local_70.xp = -NAN;
        local_70.yp = -NAN;
        local_70.w = -NAN;
        local_70.h = -NAN;
        QRectF::QRectF(&local_70,(double)in_ESI,(double)in_EDX,(double)in_ECX,(double)in_R8D);
        aleft = (double)in_stack_00000008 / 2.0;
        local_90 = 0xffffffffffffffff;
        local_88 = 0xffffffffffffffff;
        local_80 = 0xffffffffffffffff;
        local_78 = 0xffffffffffffffff;
        QMarginsF::QMarginsF((QMarginsF *)&stack0xffffffffffffff50,aleft,aleft,aleft,aleft);
        QRectF::marginsRemoved(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        QPainter::drawRoundedRect((QRectF *)in_RDI,in_XMM0_Qa,in_XMM1_Qa,(SizeMode)&local_90);
      }
      QPainterStateGuard::~QPainterStateGuard(in_stack_ffffffffffffff00);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffff10,
                 (char *)CONCAT17(bVar2,in_stack_ffffffffffffff08),
                 (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),in_stack_fffffffffffffef8);
      QMessageLogger::warning(local_38,"qDrawPlainRect: Invalid parameters");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qDrawPlainRoundedRect(QPainter *p, int x, int y, int w, int h,
                           qreal rx, qreal ry, const QColor &c,
                           int lineWidth, const QBrush *fill)
{
    if (w == 0 || h == 0)
        return;
    if (Q_UNLIKELY(w < 0 || h < 0 || lineWidth < 0)) {
        qWarning("qDrawPlainRect: Invalid parameters");
        return;
    }

    QPainterStateGuard painterGuard(p);
    if (lineWidth == 0 && !fill)
        return;
    if (lineWidth > 0)
        p->setPen(QPen(c, lineWidth));
    p->setBrush(fill ? *fill : Qt::NoBrush);
    const QRectF r(x, y, w, h);
    const auto lw2 = lineWidth / 2.;
    const QRectF rect = r.marginsRemoved(QMarginsF(lw2, lw2, lw2, lw2));
    p->drawRoundedRect(rect, rx, ry);
}